

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cpp
# Opt level: O3

value * eval::func_eval(func *func,vector<parser::thing_*,_std::allocator<parser::thing_*>_> *args,
                       context *c)

{
  _func_value_ptr_vector<parser::thing_ptr,_std::allocator<parser::thing_ptr>_>_context_ptr *p_Var1;
  mapped_type pvVar2;
  pointer pcVar3;
  vector<parser::thing_*,_std::allocator<parser::thing_*>_> vVar4;
  value *pvVar5;
  pointer pptVar6;
  mapped_type *ppvVar7;
  pointer pptVar8;
  ulong uVar9;
  _Hash_node_base *p_Var10;
  vector<eval::value_*,_std::allocator<eval::value_*>_> e_args;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>
  i;
  context c2;
  undefined8 in_stack_ffffffffffffff38;
  __buckets_ptr pp_Var11;
  undefined8 in_stack_ffffffffffffff40;
  iterator __position;
  pointer in_stack_ffffffffffffff48;
  value **ppvVar12;
  key_type local_b0;
  mapped_type local_90;
  expression *local_88;
  undefined1 local_80 [56];
  __buckets_ptr local_48;
  
  if (func->is_std_fn == true) {
    p_Var1 = func->f;
    std::vector<parser::thing_*,_std::allocator<parser::thing_*>_>::vector
              ((vector<parser::thing_*,_std::allocator<parser::thing_*>_> *)&local_48,args);
    vVar4.super__Vector_base<parser::thing_*,_std::allocator<parser::thing_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffff40;
    vVar4.super__Vector_base<parser::thing_*,_std::allocator<parser::thing_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffff38;
    vVar4.super__Vector_base<parser::thing_*,_std::allocator<parser::thing_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffff48;
    pvVar5 = (*p_Var1)(vVar4,(context *)&local_48);
  }
  else {
    pp_Var11 = (__buckets_ptr)0x0;
    __position._M_current = (value **)0x0;
    ppvVar12 = (value **)0x0;
    pptVar6 = (args->super__Vector_base<parser::thing_*,_std::allocator<parser::thing_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (8 < (ulong)((long)(args->
                          super__Vector_base<parser::thing_*,_std::allocator<parser::thing_*>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pptVar6)) {
      uVar9 = 1;
      do {
        local_80._0_8_ = eval(pptVar6[uVar9],c);
        if (__position._M_current == ppvVar12) {
          std::vector<eval::value*,std::allocator<eval::value*>>::_M_realloc_insert<eval::value*>
                    ((vector<eval::value*,std::allocator<eval::value*>> *)&stack0xffffffffffffff38,
                     __position,(value **)local_80);
        }
        else {
          *__position._M_current = (value *)local_80._0_8_;
          __position._M_current = __position._M_current + 1;
        }
        uVar9 = uVar9 + 1;
        pptVar6 = (args->super__Vector_base<parser::thing_*,_std::allocator<parser::thing_*>_>).
                  _M_impl.super__Vector_impl_data._M_start;
      } while (uVar9 < (ulong)((long)(args->
                                     super__Vector_base<parser::thing_*,_std::allocator<parser::thing_*>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pptVar6 >>
                              3));
    }
    local_80._0_8_ = local_80 + 0x30;
    local_80._8_8_ = 1;
    local_80._16_8_ = (_Hash_node_base *)0x0;
    local_80._24_8_ = 0;
    local_80._32_4_ = 1.0;
    local_80._40_8_ = 0;
    local_80._48_8_ = (__node_base_ptr)0x0;
    stdlib::init_stdlib((context *)local_80);
    p_Var10 = (c->_M_h)._M_before_begin._M_nxt;
    if (p_Var10 != (_Hash_node_base *)0x0) {
      do {
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,p_Var10[1]._M_nxt,
                   (long)&(p_Var10[1]._M_nxt)->_M_nxt + (long)&(p_Var10[2]._M_nxt)->_M_nxt);
        pvVar2 = (mapped_type)p_Var10[5]._M_nxt;
        local_90 = pvVar2;
        if (pvVar2->ty == FUNC) {
          ppvVar7 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)local_80,&local_b0);
          *ppvVar7 = pvVar2;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        p_Var10 = p_Var10->_M_nxt;
      } while (p_Var10 != (_Hash_node_base *)0x0);
    }
    local_88 = func->body;
    pptVar8 = (func->arg_list->super__Vector_base<parser::token_*,_std::allocator<parser::token_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((func->arg_list->super__Vector_base<parser::token_*,_std::allocator<parser::token_*>_>).
        _M_impl.super__Vector_impl_data._M_finish != pptVar8) {
      uVar9 = 0;
      do {
        pvVar2 = (mapped_type)pp_Var11[uVar9];
        pcVar3 = (pptVar8[uVar9]->content)._M_dataplus._M_p;
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,pcVar3,pcVar3 + (pptVar8[uVar9]->content)._M_string_length);
        ppvVar7 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_80,&local_b0);
        *ppvVar7 = pvVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        uVar9 = uVar9 + 1;
        pptVar8 = (func->arg_list->
                  super__Vector_base<parser::token_*,_std::allocator<parser::token_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      } while (uVar9 < (ulong)((long)(func->arg_list->
                                     super__Vector_base<parser::token_*,_std::allocator<parser::token_*>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pptVar8 >>
                              3));
    }
    pvVar5 = eval(&local_88->super_thing,(context *)local_80);
    local_48 = pp_Var11;
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_80);
  }
  if (local_48 != (__buckets_ptr)0x0) {
    operator_delete(local_48);
  }
  return pvVar5;
}

Assistant:

eval::value *eval::func_eval(eval::func *func, std::vector<parser::thing *> args, context &c) {

  if (func->is_std())
    return func->f(args, c);

  std::vector<eval::value *> e_args;
  for (int i = 1; i < args.size(); i++) {
    e_args.push_back(eval::eval(args[i], c));
  }

  context c2;
  stdlib::init_stdlib(c2);

  for (auto i : c) {
    if ((i.second)->get_type()==eval::type::FUNC)
      c2[i.first] = i.second;
  }

  parser::expression *e = func->get_body();
  for (int i = 0; i < func->arg_list->size(); i++) {

    c2[((*(func->arg_list))[i])->get_content()] = e_args[i];

  }

  eval::value *val = eval::eval(e, c2);

  return val;

}